

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool CheckMinimalPush(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,opcodetype opcode)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  if (OP_PUSHDATA4 < opcode) {
    __assert_fail("0 <= opcode && opcode <= OP_PUSHDATA4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/script.cpp"
                  ,0x170,"bool CheckMinimalPush(const std::vector<unsigned char> &, opcodetype)");
  }
  puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar2 - (long)puVar1;
  if (puVar2 == puVar1) {
    bVar4 = opcode == OP_0;
  }
  else if ((uVar3 == 1) && (((byte)(*puVar1 - 1) < 0x10 || (*puVar1 == 0x81)))) {
    bVar4 = false;
  }
  else if (uVar3 < 0x4c) {
    bVar4 = uVar3 == opcode;
  }
  else if (uVar3 < 0x100) {
    bVar4 = opcode == OP_PUSHDATA1;
  }
  else {
    bVar4 = opcode == OP_PUSHDATA2 || 0xffff < uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckMinimalPush(const std::vector<unsigned char>& data, opcodetype opcode) {
    // Excludes OP_1NEGATE, OP_1-16 since they are by definition minimal
    assert(0 <= opcode && opcode <= OP_PUSHDATA4);
    if (data.size() == 0) {
        // Should have used OP_0.
        return opcode == OP_0;
    } else if (data.size() == 1 && data[0] >= 1 && data[0] <= 16) {
        // Should have used OP_1 .. OP_16.
        return false;
    } else if (data.size() == 1 && data[0] == 0x81) {
        // Should have used OP_1NEGATE.
        return false;
    } else if (data.size() <= 75) {
        // Must have used a direct push (opcode indicating number of bytes pushed + those bytes).
        return opcode == data.size();
    } else if (data.size() <= 255) {
        // Must have used OP_PUSHDATA.
        return opcode == OP_PUSHDATA1;
    } else if (data.size() <= 65535) {
        // Must have used OP_PUSHDATA2.
        return opcode == OP_PUSHDATA2;
    }
    return true;
}